

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * conditional(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Obj *pCVar4;
  C_Node *pCVar5;
  C_Token *start;
  C_Token *pCVar6;
  C_Token *tok_00;
  C_Token *local_40;
  C_Token *local_38;
  
  local_40 = tok;
  local_38 = tok;
  pCVar2 = logand(parser,&local_38,tok);
  pCVar6 = local_38;
  _Var1 = C_equal(local_38,"||");
  pCVar5 = pCVar2;
  tok_00 = pCVar6;
  if (_Var1) {
    do {
      pCVar3 = logand(parser,&local_38,pCVar6->next);
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      tok_00 = local_38;
      pCVar2->kind = ND_LOGOR;
      pCVar2->tok = pCVar6;
      pCVar2->lhs = pCVar5;
      pCVar2->rhs = pCVar3;
      _Var1 = C_equal(local_38,"||");
      pCVar5 = pCVar2;
      pCVar6 = tok_00;
    } while (_Var1);
  }
  local_40 = tok_00;
  _Var1 = C_equal(tok_00,"?");
  if (_Var1) {
    _Var1 = C_equal(tok_00->next,":");
    if (_Var1) {
      C_add_type(parser,pCVar2);
      pCVar4 = new_var(parser,"",pCVar2->ty);
      pCVar4->is_local = true;
      pCVar4->next = parser->locals;
      parser->locals = pCVar4;
      pCVar5 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar5->kind = ND_VAR;
      pCVar5->tok = tok_00;
      pCVar5->var = pCVar4;
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_ASSIGN;
      pCVar3->tok = tok_00;
      pCVar3->lhs = pCVar5;
      pCVar3->rhs = pCVar2;
      pCVar5 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar5->kind = ND_COND;
      pCVar5->tok = tok_00;
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_VAR;
      pCVar2->tok = tok_00;
      pCVar2->var = pCVar4;
      pCVar5->cond = pCVar2;
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_VAR;
      pCVar2->tok = tok_00;
      pCVar2->var = pCVar4;
      pCVar5->then = pCVar2;
      pCVar2 = conditional(parser,rest,tok_00->next->next);
      pCVar5->els = pCVar2;
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_COMMA;
      pCVar2->tok = tok_00;
      pCVar2->lhs = pCVar3;
      pCVar2->rhs = pCVar5;
    }
    else {
      pCVar5 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar5->kind = ND_COND;
      pCVar5->tok = tok_00;
      pCVar5->cond = pCVar2;
      pCVar2 = expr(parser,&local_40,tok_00->next);
      pCVar5->then = pCVar2;
      local_40 = C_skip(parser,local_40,":");
      pCVar2 = conditional(parser,rest,local_40);
      pCVar5->els = pCVar2;
      pCVar2 = pCVar5;
    }
  }
  else {
    *rest = tok_00;
  }
  return pCVar2;
}

Assistant:

static C_Node *conditional(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *cond = logor(parser, &tok, tok);

  if (!C_equal(tok, "?")) {
    *rest = tok;
    return cond;
  }

  if (C_equal(tok->next, ":")) {
    // [GNU] Compile `a ?: b` as `tmp = a, tmp ? tmp : b`.
    C_add_type(parser, cond);
    C_Obj *var = new_lvar(parser, "", cond->ty);
    C_Node *lhs = new_binary(parser, ND_ASSIGN, new_var_node(parser, var, tok), cond, tok);
    C_Node *rhs = new_node(parser, ND_COND, tok);
    rhs->cond = new_var_node(parser, var, tok);
    rhs->then = new_var_node(parser, var, tok);
    rhs->els = conditional(parser, rest, tok->next->next);
    return new_binary(parser, ND_COMMA, lhs, rhs, tok);
  }

  C_Node *node = new_node(parser, ND_COND, tok);
  node->cond = cond;
  node->then = expr(parser, &tok, tok->next);
  tok = C_skip(parser, tok, ":");
  node->els = conditional(parser, rest, tok);
  return node;
}